

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roll-parser.cpp
# Opt level: O0

int __thiscall
ORPG::ExpressionTree::parse_input_string
          (ExpressionTree *this,string *buff,int *numBytesRead,int maxBytesToRead)

{
  int iVar1;
  int local_30;
  int i;
  int bytesRemaining;
  int numBytesToRead;
  int maxBytesToRead_local;
  int *numBytesRead_local;
  string *buff_local;
  ExpressionTree *this_local;
  
  iVar1 = std::__cxx11::string::length();
  iVar1 = iVar1 - this->globalReadOffset;
  i = maxBytesToRead;
  if (iVar1 < maxBytesToRead) {
    i = iVar1;
  }
  std::__cxx11::string::clear();
  for (local_30 = 0; local_30 < i; local_30 = local_30 + 1) {
    std::__cxx11::string::operator[]((ulong)&this->inputString);
    std::__cxx11::string::push_back((char)buff);
  }
  *numBytesRead = i;
  this->globalReadOffset = i + this->globalReadOffset;
  return 0;
}

Assistant:

int ExpressionTree::parse_input_string(string* buff, int* numBytesRead, int maxBytesToRead) {
        int numBytesToRead = maxBytesToRead;
        int bytesRemaining = inputString.length() - globalReadOffset;
        
        if(numBytesToRead > bytesRemaining) { numBytesToRead = bytesRemaining; }

        buff->clear();

        for(int i = 0; i < numBytesToRead; i++)
            buff->push_back(inputString[i + globalReadOffset]);
        
        *numBytesRead = numBytesToRead;
        globalReadOffset += numBytesToRead;
        
        return 0;
    }